

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderPropertiesProgramObject::initTest
          (TessellationShaderPropertiesProgramObject *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  GLint vs_compile_status;
  GLint fs_compile_status;
  char *vs_body;
  char *fs_body;
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != true) {
    return;
  }
  GVar2 = (**(code **)(lVar4 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                  ,0xd5);
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar2;
  GVar2 = (**(code **)(lVar4 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER)
  ;
  this->m_tc_id = GVar2;
  GVar2 = (**(code **)(lVar4 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_te_id = GVar2;
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                  ,0xdb);
  (**(code **)(lVar4 + 0x10))(this->m_po_id,this->m_fs_id);
  (**(code **)(lVar4 + 0x10))(this->m_po_id,this->m_tc_id);
  (**(code **)(lVar4 + 0x10))(this->m_po_id,this->m_te_id);
  (**(code **)(lVar4 + 0x10))(this->m_po_id,this->m_vs_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                  ,0xe2);
  fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  vs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  fs_compile_status = 0;
  vs_compile_status = 0;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&fs_body);
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&vs_body);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                  ,0xf7);
  (**(code **)(lVar4 + 0x248))(this->m_fs_id);
  (**(code **)(lVar4 + 0x248))(this->m_vs_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                  ,0xfb);
  (**(code **)(lVar4 + 0xa70))(this->m_fs_id,0x8b81,&fs_compile_status);
  (**(code **)(lVar4 + 0xa70))(this->m_vs_id,0x8b81,&vs_compile_status);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                  ,0xff);
  if (fs_compile_status == 1) {
    if (vs_compile_status == 1) {
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
               ,0x108);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
               ,0x103);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderPropertiesProgramObject::initTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extension is not supported */
	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	/* Generate all objects */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Attach the shader to the program object */
	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_tc_id);
	gl.attachShader(m_po_id, m_te_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Since this test does not care much about fragment & vertex shaders, set
	 * their bodies and compile these shaders now */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	glw::GLint fs_compile_status = GL_FALSE;
	glw::GLint vs_compile_status = GL_FALSE;

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

	gl.compileShader(m_fs_id);
	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

	gl.getShaderiv(m_fs_id, GL_COMPILE_STATUS, &fs_compile_status);
	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &vs_compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

	if (fs_compile_status != GL_TRUE)
	{
		TCU_FAIL("Could not compile fragment shader");
	}

	if (vs_compile_status != GL_TRUE)
	{
		TCU_FAIL("Could not compile vertex shader");
	}
}